

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageLine(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  double dVar20;
  int local_98;
  int local_94;
  int local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_54 = y2;
  local_50 = x2;
  local_4c = y1;
  local_48 = x1;
  if (color == -7) {
    iVar5 = im->AA_color;
    local_44 = y2;
    local_40 = x2;
    local_3c = y1;
    local_38 = x1;
    if (im->trueColor == 0) {
      gdImageLine(im,x1,y1,x2,y2,iVar5);
    }
    else {
      iVar11 = im->thick;
      iVar3 = clip_1d(&local_38,&local_3c,&local_40,&local_44,im->cx1,im->cx2);
      if ((iVar3 != 0) &&
         (iVar4 = clip_1d(&local_3c,&local_38,&local_44,&local_40,im->cy1,im->cy2), iVar3 = local_38
         , iVar7 = local_3c, iVar6 = local_40, iVar17 = local_44, iVar4 != 0)) {
        if (local_3c == local_44 && local_38 == local_40) {
          gdImageSetPixel(im,local_40,local_44,iVar5);
        }
        else {
          uVar13 = local_40 - local_38;
          uVar15 = local_44 - local_3c;
          uVar14 = -uVar15;
          if (0 < (int)uVar15) {
            uVar14 = uVar15;
          }
          uVar2 = -uVar13;
          if (0 < (int)uVar13) {
            uVar2 = uVar13;
          }
          dVar20 = atan2((double)(int)uVar15,(double)(int)uVar13);
          if (uVar14 < uVar2) {
            dVar20 = cos(dVar20);
          }
          else {
            dVar20 = sin(dVar20);
          }
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            iVar11 = (int)((double)iVar11 / ABS(dVar20));
          }
          else {
            iVar11 = 1;
          }
          iVar11 = iVar11 + (uint)(iVar11 == 0);
          iVar4 = iVar3 - iVar6;
          if (iVar4 == 0) {
            gdImageVLine(im,iVar6,iVar7,iVar17,iVar5);
          }
          else {
            iVar12 = iVar7 - iVar17;
            if (iVar12 == 0) {
              gdImageHLine(im,iVar17,iVar3,iVar6,iVar5);
            }
            else {
              lVar8 = (long)(int)uVar13;
              lVar10 = (long)(int)uVar15;
              if (uVar14 < uVar2) {
                iVar16 = iVar6;
                if ((int)uVar13 < 0) {
                  lVar8 = (long)iVar4;
                  lVar10 = (long)iVar12;
                  iVar16 = iVar3;
                  iVar3 = iVar6;
                  iVar7 = iVar17;
                }
                if (iVar3 <= iVar16) {
                  lVar9 = 0;
                  lVar18 = (long)iVar3;
                  do {
                    if (0 < iVar11) {
                      iVar17 = iVar7 - iVar11 / 2;
                      iVar3 = iVar11 + iVar17;
                      uVar14 = (uint)((ulong)lVar9 >> 8) & 0xff;
                      do {
                        gdImageSetAAPixelColor(im,(int)lVar18,iVar17,iVar5,uVar14);
                        iVar17 = iVar17 + 1;
                        gdImageSetAAPixelColor(im,(int)lVar18,iVar17,iVar5,uVar14 ^ 0xff);
                      } while (iVar17 < iVar3);
                    }
                    lVar9 = lVar9 + (lVar10 << 0x10) / lVar8;
                    if (lVar9 < 0x10000) {
                      if (lVar9 < 0) {
                        lVar9 = lVar9 + 0x10000;
                        iVar7 = iVar7 + -1;
                      }
                    }
                    else {
                      lVar9 = lVar9 + -0x10000;
                      iVar7 = iVar7 + 1;
                    }
                    bVar1 = lVar18 < iVar16;
                    lVar18 = lVar18 + 1;
                  } while (bVar1);
                }
              }
              else {
                iVar16 = iVar17;
                if ((int)uVar15 < 0) {
                  lVar8 = (long)iVar4;
                  lVar10 = (long)iVar12;
                  iVar16 = iVar7;
                  iVar3 = iVar6;
                  iVar7 = iVar17;
                }
                if (iVar7 <= iVar16) {
                  lVar9 = 0;
                  lVar18 = (long)iVar7;
                  do {
                    if (0 < iVar11) {
                      iVar17 = iVar3 - iVar11 / 2;
                      iVar7 = iVar11 + iVar17;
                      uVar14 = (uint)((ulong)lVar9 >> 8) & 0xff;
                      do {
                        gdImageSetAAPixelColor(im,iVar17,(int)lVar18,iVar5,uVar14);
                        iVar17 = iVar17 + 1;
                        gdImageSetAAPixelColor(im,iVar17,(int)lVar18,iVar5,uVar14 ^ 0xff);
                      } while (iVar17 < iVar7);
                    }
                    lVar9 = lVar9 + (lVar8 << 0x10) / lVar10;
                    if (lVar9 < 0x10000) {
                      if (lVar9 < 0) {
                        lVar9 = lVar9 + 0x10000;
                        iVar3 = iVar3 + -1;
                      }
                    }
                    else {
                      lVar9 = lVar9 + -0x10000;
                      iVar3 = iVar3 + 1;
                    }
                    bVar1 = lVar18 < iVar16;
                    lVar18 = lVar18 + 1;
                  } while (bVar1);
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    iVar5 = clip_1d(&local_48,&local_4c,&local_50,&local_54,im->cx1,im->cx2);
    if ((iVar5 != 0) &&
       (iVar17 = clip_1d(&local_4c,&local_48,&local_54,&local_50,im->cy1,im->cy2), iVar7 = local_48,
       iVar3 = local_4c, iVar5 = local_50, iVar11 = local_54, iVar17 != 0)) {
      uVar13 = local_50 - local_48;
      uVar14 = -uVar13;
      if (0 < (int)uVar13) {
        uVar14 = uVar13;
      }
      uVar15 = local_54 - local_4c;
      uVar13 = -uVar15;
      if (0 < (int)uVar15) {
        uVar13 = uVar15;
      }
      iVar17 = local_50 - local_48;
      if (iVar17 == 0) {
        gdImageVLine(im,local_50,local_4c,local_54,color);
        return;
      }
      if (local_54 == local_4c) {
        gdImageHLine(im,local_54,local_48,local_50,color);
        return;
      }
      local_98 = local_4c;
      local_94 = local_48;
      iVar6 = im->thick;
      dVar20 = atan2((double)(int)uVar13,(double)(int)uVar14);
      if (uVar13 < uVar14 || uVar13 - uVar14 == 0) {
        dVar20 = cos(dVar20);
        iVar17 = (int)((double)iVar6 / dVar20);
        iVar17 = iVar17 + (uint)(iVar17 == 0);
        iVar3 = 1;
        if (dVar20 != 0.0) {
          iVar3 = iVar17;
        }
        if (NAN(dVar20)) {
          iVar3 = iVar17;
        }
        if (iVar5 < iVar7) {
          local_98 = iVar11;
          local_60 = -1;
          iVar11 = iVar5;
          iVar5 = iVar7;
        }
        else {
          local_60 = 1;
          iVar11 = iVar7;
        }
        iVar7 = uVar13 * 2;
        iVar17 = iVar3 / 2;
        if (0 < iVar3) {
          iVar4 = local_98 - iVar17;
          iVar6 = iVar4 + iVar3;
          do {
            gdImageSetPixel(im,iVar11,iVar4,color);
            iVar4 = iVar4 + 1;
          } while (iVar4 < iVar6);
        }
        iVar4 = iVar7 - uVar14;
        iVar6 = (uVar13 - uVar14) * 2;
        if ((int)(local_60 * uVar15) < 1) {
          if (iVar11 < iVar5) {
            do {
              iVar11 = iVar11 + 1;
              iVar12 = iVar7;
              if (-1 < iVar4) {
                iVar12 = iVar6;
              }
              local_98 = local_98 - (uint)(-1 < iVar4);
              if (0 < iVar3) {
                iVar19 = local_98 - iVar17;
                iVar16 = iVar19 + iVar3;
                do {
                  gdImageSetPixel(im,iVar11,iVar19,color);
                  iVar19 = iVar19 + 1;
                } while (iVar19 < iVar16);
              }
              iVar4 = iVar4 + iVar12;
            } while (iVar11 != iVar5);
          }
        }
        else if (iVar11 < iVar5) {
          do {
            iVar11 = iVar11 + 1;
            iVar12 = iVar7;
            if (-1 < iVar4) {
              iVar12 = iVar6;
            }
            local_98 = (uint)(-1 < iVar4) + local_98;
            if (0 < iVar3) {
              iVar19 = local_98 - iVar17;
              iVar16 = iVar19 + iVar3;
              do {
                gdImageSetPixel(im,iVar11,iVar19,color);
                iVar19 = iVar19 + 1;
              } while (iVar19 < iVar16);
            }
            iVar4 = iVar4 + iVar12;
          } while (iVar11 != iVar5);
        }
      }
      else {
        dVar20 = sin(dVar20);
        iVar6 = (int)((double)iVar6 / dVar20);
        iVar6 = iVar6 + (uint)(iVar6 == 0);
        iVar7 = 1;
        if (dVar20 != 0.0) {
          iVar7 = iVar6;
        }
        if (NAN(dVar20)) {
          iVar7 = iVar6;
        }
        if (iVar11 < iVar3) {
          local_94 = iVar5;
          local_34 = -1;
          iVar5 = iVar11;
          iVar11 = iVar3;
        }
        else {
          local_34 = 1;
          iVar5 = iVar3;
        }
        iVar3 = uVar14 * 2;
        iVar6 = iVar7 / 2;
        if (0 < iVar7) {
          iVar4 = local_94 - iVar6;
          iVar12 = iVar7 + iVar4;
          do {
            gdImageSetPixel(im,iVar4,iVar5,color);
            iVar4 = iVar4 + 1;
          } while (iVar4 < iVar12);
        }
        iVar12 = iVar3 - uVar13;
        iVar4 = (uVar14 - uVar13) * 2;
        if (local_34 * iVar17 < 1) {
          if (iVar5 < iVar11) {
            do {
              iVar5 = iVar5 + 1;
              iVar17 = iVar3;
              if (-1 < iVar12) {
                iVar17 = iVar4;
              }
              local_94 = local_94 - (uint)(-1 < iVar12);
              if (0 < iVar7) {
                iVar16 = local_94 - iVar6;
                iVar19 = iVar7 + iVar16;
                do {
                  gdImageSetPixel(im,iVar16,iVar5,color);
                  iVar16 = iVar16 + 1;
                } while (iVar16 < iVar19);
              }
              iVar12 = iVar12 + iVar17;
            } while (iVar5 != iVar11);
          }
        }
        else if (iVar5 < iVar11) {
          do {
            iVar5 = iVar5 + 1;
            iVar17 = iVar3;
            if (-1 < iVar12) {
              iVar17 = iVar4;
            }
            local_94 = (uint)(-1 < iVar12) + local_94;
            if (0 < iVar7) {
              iVar16 = local_94 - iVar6;
              iVar19 = iVar7 + iVar16;
              do {
                gdImageSetPixel(im,iVar16,iVar5,color);
                iVar16 = iVar16 + 1;
              } while (iVar16 < iVar19);
            }
            iVar12 = iVar12 + iVar17;
          } while (iVar5 != iVar11);
        }
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageLine (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int dx, dy, incr1, incr2, d, x, y, xend, yend, xdirflag, ydirflag;
	int wid;
	int w, wstart;
	int thick;

	if (color == gdAntiAliased) {
		/*
		  gdAntiAliased passed as color: use the much faster, much cheaper
		  and equally attractive gdImageAALine implementation. That
		  clips too, so don't clip twice.
		*/
		gdImageAALine(im, x1, y1, x2, y2, im->AA_color);
		return;
	}
	/* 2.0.10: Nick Atty: clip to edges of drawing rectangle, return if no
	   points need to be drawn. 2.0.26, TBB: clip to edges of clipping
	   rectangle. We were getting away with this because gdImageSetPixel
	   is used for actual drawing, but this is still more efficient and opens
	   the way to skip per-pixel bounds checking in the future. */

	if (clip_1d (&x1, &y1, &x2, &y2, im->cx1, im->cx2) == 0)
		return;
	if (clip_1d (&y1, &x1, &y2, &x2, im->cy1, im->cy2) == 0)
		return;
	thick = im->thick;

	dx = abs (x2 - x1);
	dy = abs (y2 - y1);

	if (dx == 0) {
		gdImageVLine(im, x1, y1, y2, color);
		return;
	} else if (dy == 0) {
		gdImageHLine(im, y1, x1, x2, color);
		return;
	}

	if (dy <= dx) {
		/* More-or-less horizontal. use wid for vertical stroke */
		/* Doug Claar: watch out for NaN in atan2 (2.0.5) */
		
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
			  TBB: but watch out for /0! */
		double ac = cos (atan2 (dy, dx));
		if (ac != 0) {
			wid = thick / ac;
		} else {
			wid = 1;
		}
		if (wid == 0) {
			wid = 1;
		}
		d = 2 * dy - dx;
		incr1 = 2 * dy;
		incr2 = 2 * (dy - dx);
		if (x1 > x2) {
			x = x2;
			y = y2;
			ydirflag = (-1);
			xend = x1;
		} else {
			x = x1;
			y = y1;
			ydirflag = 1;
			xend = x2;
		}

		/* Set up line thickness */
		wstart = y - wid / 2;
		for (w = wstart; w < wstart + wid; w++)
			gdImageSetPixel (im, x, w, color);

		if (((y2 - y1) * ydirflag) > 0) {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y++;
					d += incr2;
				}
				wstart = y - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, x, w, color);
			}
		} else {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y--;
					d += incr2;
				}
				wstart = y - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, x, w, color);
			}
		}
	} else {
		/* More-or-less vertical. use wid for horizontal stroke */
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		if (wid == 0)
			wid = 1;

		d = 2 * dx - dy;
		incr1 = 2 * dx;
		incr2 = 2 * (dx - dy);
		if (y1 > y2) {
			y = y2;
			x = x2;
			yend = y1;
			xdirflag = (-1);
		} else {
			y = y1;
			x = x1;
			yend = y2;
			xdirflag = 1;
		}

		/* Set up line thickness */
		wstart = x - wid / 2;
		for (w = wstart; w < wstart + wid; w++)
			gdImageSetPixel (im, w, y, color);

		if (((x2 - x1) * xdirflag) > 0) {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x++;
					d += incr2;
				}
				wstart = x - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, w, y, color);
			}
		} else {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x--;
					d += incr2;
				}
				wstart = x - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, w, y, color);
			}
		}
	}

}